

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O3

uint __thiscall
pktalloc::CustomBitSet<2048U>::FindFirstSet(CustomBitSet<2048U> *this,uint bitStart,uint bitEnd)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(bitStart >> 6);
  uVar3 = *(ulong *)(this + uVar2 * 8) >> ((ulong)bitStart & 0x3f);
  if (uVar3 == 0) {
    bitStart = bitStart & 0xffffffc0;
    do {
      uVar2 = uVar2 + 1;
      if (bitEnd + 0x3f >> 6 <= uVar2) {
        return bitEnd;
      }
      uVar3 = *(ulong *)(this + uVar2 * 8);
      bitStart = bitStart + 0x40;
    } while (uVar3 == 0);
    iVar1 = 0;
    for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar1 = 0;
    for (uVar2 = uVar3; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    if ((uVar3 & 1) != 0) {
      iVar1 = 0;
    }
  }
  return iVar1 + bitStart;
}

Assistant:

unsigned FindFirstSet(unsigned bitStart, unsigned bitEnd = kValidBits)
    {
        static_assert(kWordBits == 64, "Update this");

        unsigned wordStart = bitStart / kWordBits;

        WordT word = Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        const unsigned wordEnd = (bitEnd + kWordBits - 1) / kWordBits;

        for (unsigned i = wordStart + 1; i < wordEnd; ++i)
        {
            word = Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return bitEnd;
    }